

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::DescriptorPoolFeaturesTest_OverrideDefaults_Test::
~DescriptorPoolFeaturesTest_OverrideDefaults_Test
          (DescriptorPoolFeaturesTest_OverrideDefaults_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest(&this->super_DescriptorPoolFeaturesTest);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(DescriptorPoolFeaturesTest, OverrideDefaults) {
  FeatureSetDefaults defaults = ParseTextOrDie(R"pb(
    defaults {
      edition: EDITION_PROTO2
      overridable_features {
        field_presence: EXPLICIT
        enum_type: CLOSED
        repeated_field_encoding: EXPANDED
        utf8_validation: VERIFY
        message_encoding: LENGTH_PREFIXED
        json_format: ALLOW
        enforce_naming_style: STYLE_LEGACY
        default_symbol_visibility: EXPORT_ALL
      }
    }
    minimum_edition: EDITION_PROTO2
    maximum_edition: EDITION_2023
  )pb");
  EXPECT_OK(pool_.SetFeatureSetDefaults(std::move(defaults)));

  FileDescriptorProto file_proto = ParseTextOrDie(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_PROTO3
  )pb");

  BuildDescriptorMessagesInTestPool();
  const FileDescriptor* file = ABSL_DIE_IF_NULL(pool_.BuildFile(file_proto));
  EXPECT_THAT(GetFeatures(file), EqualsProto(R"pb(
                field_presence: EXPLICIT
                enum_type: CLOSED
                repeated_field_encoding: EXPANDED
                utf8_validation: VERIFY
                message_encoding: LENGTH_PREFIXED
                json_format: ALLOW
                enforce_naming_style: STYLE_LEGACY
                default_symbol_visibility: EXPORT_ALL
              )pb"));
}